

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_object.cpp
# Opt level: O1

void __thiscall
mjs::function_object::put_function
          (function_object *this,gc_heap_ptr<mjs::gc_function> *f,gc_heap_ptr<mjs::gc_string> *name,
          gc_heap_ptr<mjs::gc_string> *body_text,int named_args)

{
  if (((((this->call_).pos_ == 0) && ((this->text_).pos_ == 0)) && (this->named_args_ == 0)) &&
     (this->is_native_ != true)) {
    (this->call_).pos_ = (f->super_gc_heap_ptr_untyped).pos_;
    if ((body_text->super_gc_heap_ptr_untyped).heap_ == (gc_heap *)0x0) {
      (this->text_).pos_ = (name->super_gc_heap_ptr_untyped).pos_;
      this->is_native_ = true;
    }
    else {
      if ((name->super_gc_heap_ptr_untyped).heap_ != (gc_heap *)0x0) {
        __assert_fail("!name",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/function_object.cpp"
                      ,0x81,
                      "void mjs::function_object::put_function(const gc_heap_ptr<gc_function> &, const gc_heap_ptr<gc_string> &, const gc_heap_ptr<gc_string> &, int)"
                     );
      }
      (this->text_).pos_ = (body_text->super_gc_heap_ptr_untyped).pos_;
    }
    this->named_args_ = named_args;
    return;
  }
  __assert_fail("!call_ && !text_ && !named_args_ && !is_native_",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/function_object.cpp"
                ,0x7b,
                "void mjs::function_object::put_function(const gc_heap_ptr<gc_function> &, const gc_heap_ptr<gc_string> &, const gc_heap_ptr<gc_string> &, int)"
               );
}

Assistant:

void function_object::put_function(const gc_heap_ptr<gc_function>& f, const gc_heap_ptr<gc_string>& name, const gc_heap_ptr<gc_string>& body_text, int named_args) {
    assert(!call_ && !text_ && !named_args_ && !is_native_);
    call_ = f;
    if (!body_text) {
        text_ = name;
        is_native_ = true;
    } else {
        assert(!name);
        text_ = body_text;
    }
    named_args_ = named_args;
}